

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

bool Imath_2_5::extractSHRT<float>
               (Matrix44<float> *mat,Vec3<float> *s,Vec3<float> *h,Vec3<float> *r,Vec3<float> *t,
               bool exc,Order rOrder)

{
  bool bVar1;
  Euler<float> local_a0;
  Euler<float> e;
  Euler<float> eXYZ;
  Matrix44<float> rot;
  
  rot.x[1][3] = 0.0;
  rot.x[2][0] = 0.0;
  rot.x[2][3] = 0.0;
  rot.x[3][0] = 0.0;
  rot.x[0][1] = 0.0;
  rot.x[0][2] = 0.0;
  rot.x[0][3] = 0.0;
  rot.x[1][0] = 0.0;
  rot.x[3][1] = 0.0;
  rot.x[3][2] = 0.0;
  rot.x[0][0] = 1.0;
  rot.x[1][1] = 1.0;
  rot.x[1][2] = 0.0;
  rot.x[2][1] = 0.0;
  rot.x[2][2] = 1.0;
  rot.x[3][3] = 1.0;
  Matrix44<float>::operator=(&rot,mat);
  bVar1 = extractAndRemoveScalingAndShear<float>(&rot,s,h,exc);
  if (bVar1) {
    extractEulerXYZ<float>(&rot,r);
    t->x = mat->x[3][0];
    t->y = mat->x[3][1];
    t->z = mat->x[3][2];
    if (rOrder != Default) {
      Euler<float>::Euler(&eXYZ,r,Default,IJKLayout);
      Euler<float>::Euler(&e,&eXYZ,rOrder);
      Euler<float>::toXYZVector(&local_a0);
      r->x = local_a0.super_Vec3<float>.x;
      r->y = local_a0.super_Vec3<float>.y;
      r->z = local_a0.super_Vec3<float>.z;
    }
  }
  return bVar1;
}

Assistant:

bool 
extractSHRT (const Matrix44<T> &mat,
	     Vec3<T> &s,
	     Vec3<T> &h,
	     Vec3<T> &r,
	     Vec3<T> &t,
	     bool exc /* = true */ ,
	     typename Euler<T>::Order rOrder /* = Euler<T>::XYZ */ )
{
    Matrix44<T> rot;

    rot = mat;
    if (! extractAndRemoveScalingAndShear (rot, s, h, exc))
	return false;

    extractEulerXYZ (rot, r);

    t.x = mat[3][0];
    t.y = mat[3][1];
    t.z = mat[3][2];

    if (rOrder != Euler<T>::XYZ)
    {
	IMATH_INTERNAL_NAMESPACE::Euler<T> eXYZ (r, IMATH_INTERNAL_NAMESPACE::Euler<T>::XYZ);
	IMATH_INTERNAL_NAMESPACE::Euler<T> e (eXYZ, rOrder);
	r = e.toXYZVector ();
    }

    return true;
}